

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cpp
# Opt level: O3

file_handle * __thiscall pstore::file::file_handle::operator=(file_handle *this,file_handle *rhs)

{
  close(this,(int)rhs);
  std::__cxx11::string::operator=((string *)&this->path_,(string *)&rhs->path_);
  this->file_ = rhs->file_;
  this->is_writable_ = rhs->is_writable_;
  rhs->file_ = -1;
  rhs->is_writable_ = false;
  return this;
}

Assistant:

file_handle & file_handle::operator= (file_handle && rhs) noexcept {
            no_ex_escape ([this] () { this->close (); });

            path_ = std::move (rhs.path_);
            file_ = rhs.file_;
            is_writable_ = rhs.is_writable_;

            rhs.file_ = invalid_oshandle;
            rhs.is_writable_ = false;
            return *this;
        }